

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *a,ImVec2 *c,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  float fVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  ImDrawIdx IVar4;
  ImVec2 uv;
  
  if (0xffffff < (col_upr_right | col_upr_left | col_bot_right | col_bot_left)) {
    uv = GImGui->FontTexUvWhitePixel;
    PrimReserve(this,6,4);
    pIVar2 = this->_IdxWritePtr;
    IVar4 = (ImDrawIdx)this->_VtxCurrentIdx;
    *pIVar2 = IVar4;
    pIVar2[1] = IVar4 + 1;
    pIVar2[2] = IVar4 + 2;
    pIVar2[3] = IVar4;
    pIVar2[4] = IVar4 + 2;
    pIVar2[5] = IVar4 + 3;
    this->_IdxWritePtr = pIVar2 + 6;
    PrimWriteVtx(this,a,&uv,col_upr_left);
    fVar1 = a->y;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->pos).x = c->x;
    (pIVar3->pos).y = fVar1;
    this->_VtxWritePtr->uv = uv;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = col_upr_right;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    PrimWriteVtx(this,c,&uv,col_bot_right);
    fVar1 = c->y;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->pos).x = a->x;
    (pIVar3->pos).y = fVar1;
    this->_VtxWritePtr->uv = uv;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = col_bot_left;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& a, const ImVec2& c, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) >> 24) == 0)
        return;

    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+3));
    PrimWriteVtx(a, uv, col_upr_left);
    PrimWriteVtx(ImVec2(c.x, a.y), uv, col_upr_right);
    PrimWriteVtx(c, uv, col_bot_right);
    PrimWriteVtx(ImVec2(a.x, c.y), uv, col_bot_left);
}